

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseTimeCoordinator.cpp
# Opt level: O1

TimeProcessingResult __thiscall
helics::BaseTimeCoordinator::processTimeMessage(BaseTimeCoordinator *this,ActionMessage *cmd)

{
  _Alloc_hider __src;
  TimeProcessingResult TVar1;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  checkRes;
  ActionMessage error;
  pair<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_100;
  ActionMessage local_d8;
  
  if (((uint)(cmd->messageAction + (cmd_route_ack|cmd_init)) < 4) ||
     (cmd->messageAction == cmd_disconnect)) {
    (*this->_vptr_BaseTimeCoordinator[7])(this,(ulong)(uint)(cmd->source_id).gid);
  }
  TVar1 = TimeDependencies::updateTime(&this->dependencies,cmd);
  if (TVar1 == PROCESSED_AND_CHECK) {
    TimeDependencies::checkForIssues_abi_cxx11_(&local_100,&this->dependencies,false);
    if (local_100.first != 0) {
      ActionMessage::ActionMessage(&local_d8,cmd_global_error);
      __src._M_p = local_100.second._M_dataplus._M_p;
      local_d8.dest_id.gid = 0;
      local_d8.source_id.gid = (this->mSourceId).gid;
      local_d8.messageID = local_100.first;
      if ((byte *)local_100.second._M_dataplus._M_p == local_d8.payload.heap) {
        local_d8.payload.bufferSize = local_100.second._M_string_length;
      }
      else {
        SmallBuffer::reserve(&local_d8.payload,local_100.second._M_string_length);
        local_d8.payload.bufferSize = local_100.second._M_string_length;
        if (local_100.second._M_string_length != 0) {
          memcpy(local_d8.payload.heap,__src._M_p,local_100.second._M_string_length);
        }
      }
      if ((this->sendMessageFunction).super__Function_base._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      (*(this->sendMessageFunction)._M_invoker)((_Any_data *)&this->sendMessageFunction,&local_d8);
      ActionMessage::~ActionMessage(&local_d8);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_100.second._M_dataplus._M_p != &local_100.second.field_2) {
      operator_delete(local_100.second._M_dataplus._M_p,
                      local_100.second.field_2._M_allocated_capacity + 1);
    }
  }
  return TVar1;
}

Assistant:

TimeProcessingResult BaseTimeCoordinator::processTimeMessage(const ActionMessage& cmd)
{
    switch (cmd.action()) {
        case CMD_DISCONNECT:
        case CMD_DISCONNECT_BROKER:
        case CMD_DISCONNECT_FED:
        case CMD_DISCONNECT_CORE:
        case CMD_BROADCAST_DISCONNECT:
            removeDependent(cmd.source_id);
            break;
        default:
            break;
    }
    auto procRes = dependencies.updateTime(cmd);
    if (procRes == TimeProcessingResult::PROCESSED_AND_CHECK) {
        auto checkRes = dependencies.checkForIssues(false);
        if (checkRes.first != 0) {
            ActionMessage error(CMD_GLOBAL_ERROR);
            error.dest_id = parent_broker_id;
            error.source_id = mSourceId;
            error.messageID = checkRes.first;
            error.payload = checkRes.second;
            sendMessageFunction(error);
        }
    }
    return procRes;
}